

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O2

void __thiscall
dbwrapper_tests::existing_data_no_obfuscate::test_method(existing_data_no_obfuscate *this)

{
  long lVar1;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_00;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  uint256 *puVar5;
  FastRandomContext *this_00;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  check_type cVar7;
  string *psVar6;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  uint8_t key;
  unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> dbw;
  undefined1 local_218 [32];
  string local_1f8;
  undefined1 local_1d8 [32];
  uint256 res3;
  uint256 res2;
  CDBWrapper odbw;
  uint256 in2;
  uint256 res;
  uint256 in;
  path local_88;
  path ph;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::operator/(&ph,(path *)&local_88,"existing_data_no_obfuscate");
  std::filesystem::__cxx11::path::~path(&local_88);
  fs::create_directories(&ph.super_path);
  std::filesystem::__cxx11::path::path((path *)&odbw,&ph.super_path);
  odbw.obfuscate_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x400;
  odbw.obfuscate_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  std::make_unique<CDBWrapper,DBParams>((DBParams *)&dbw);
  std::filesystem::__cxx11::path::~path((path *)&odbw);
  key = 'k';
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  RandomMixin<FastRandomContext>::rand256(&in,&this_00->super_RandomMixin<FastRandomContext>);
  res.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xda;
  file.m_begin = (iterator)&local_238;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_248,msg);
  bVar2 = CDBWrapper::Write<unsigned_char,uint256>
                    ((CDBWrapper *)
                     dbw._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>.
                     _M_t.super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                     super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,&key,&in,false);
  res2.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_5a966f;
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"dbw->Write(key, in)" + 0x13;
  odbw.m_name._M_dataplus._M_p._0_1_ = 0;
  odbw.m_db_context._M_t.super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
  ._M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<LevelDBContext,_std::default_delete<LevelDBContext>,_true,_true>)
       &PTR__lazy_ostream_011481f0;
  odbw.m_name._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_250 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  odbw.m_name.field_2._M_allocated_capacity = (size_type)&in2;
  res2.super_base_blob<256U>.m_data._M_elems[0] = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&res2,(lazy_ostream *)&odbw,1,0,WARN,_cVar7,(size_t)&local_258,0xda
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)(res2.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xdb;
  file_00.m_begin = (iterator)&local_268;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
             msg_00);
  res2.super_base_blob<256U>.m_data._M_elems[0] =
       CDBWrapper::Read<unsigned_char,uint256>
                 ((CDBWrapper *)
                  dbw._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,&key,&res);
  res2.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_5a967a;
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"dbw->Read(key, res)" + 0x13;
  odbw.m_name._M_dataplus._M_p._0_1_ = 0;
  odbw.m_db_context._M_t.super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
  ._M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<LevelDBContext,_std::default_delete<LevelDBContext>,_true,_true>)
       &PTR__lazy_ostream_011481f0;
  odbw.m_name._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_280 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  odbw.m_name.field_2._M_allocated_capacity = (size_type)&in2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&res2,(lazy_ostream *)&odbw,1,0,WARN,_cVar7,(size_t)&local_288,0xdb
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)(res2.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xdc;
  file_01.m_begin = (iterator)&local_298;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2a8,
             msg_01);
  odbw.m_name._M_dataplus._M_p._0_1_ = 0;
  odbw.m_db_context._M_t.super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
  ._M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<LevelDBContext,_std::default_delete<LevelDBContext>,_true,_true>)
       &PTR__lazy_ostream_011480b0;
  odbw.m_name._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  odbw.m_name.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2b0 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&res2,(base_blob<256u> *)&res);
  psVar6 = (string *)&in2;
  base_blob<256u>::ToString_abi_cxx11_(psVar6,(base_blob<256u> *)&in);
  pvVar3 = (iterator)0x2;
  puVar5 = &res2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&odbw,&local_2b8,0xdc,1,2,puVar5,"res.ToString()",psVar6,"in.ToString()");
  std::__cxx11::string::~string((string *)&in2);
  std::__cxx11::string::~string((string *)&res2);
  std::__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>::reset
            ((__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_> *)&dbw,(pointer)0x0);
  std::filesystem::__cxx11::path::path((path *)&res2,&ph.super_path);
  CDBWrapper::CDBWrapper(&odbw,(DBParams *)&res2);
  std::filesystem::__cxx11::path::~path((path *)&res2);
  res2.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xe7;
  file_02.m_begin = (iterator)&local_2c8;
  msg_02.m_end = (iterator)puVar5;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2d8,
             msg_02);
  bVar2 = CDBWrapper::Read<unsigned_char,uint256>(&odbw,&key,&res2);
  res3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems._24_8_ = local_1d8;
  local_1d8._0_8_ = "odbw.Read(key, res2)";
  local_1d8._8_8_ = "";
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       in2.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_011481f0;
  in2.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2e0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  res3.super_base_blob<256U>.m_data._M_elems[0] = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&res3,(lazy_ostream *)&in2,1,0,WARN,(check_type)psVar6,
             (size_t)&local_2e8,0xe7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(res3.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xe8;
  file_03.m_begin = (iterator)&local_2f8;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_308,
             msg_03);
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       in2.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_011480b0;
  in2.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  in2.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_310 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&res3,(base_blob<256u> *)&res2);
  psVar6 = (string *)local_1d8;
  base_blob<256u>::ToString_abi_cxx11_(psVar6,(base_blob<256u> *)&in);
  pvVar3 = (iterator)0x2;
  puVar5 = &res3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&in2,&local_318,0xe8,1,2,puVar5,"res2.ToString()",psVar6,"in.ToString()");
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)&res3);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xea;
  file_04.m_begin = (iterator)&local_328;
  msg_04.m_end = (iterator)puVar5;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_338,
             msg_04);
  bVar2 = CDBWrapper::IsEmpty(&odbw);
  res3.super_base_blob<256U>.m_data._M_elems[0] = !bVar2;
  res3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1d8._0_8_ = "!odbw.IsEmpty()";
  local_1d8._8_8_ = "";
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       in2.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_011481f0;
  in2.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_340 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  in2.super_base_blob<256U>.m_data._M_elems._24_8_ = (string *)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&res3,(lazy_ostream *)&in2,1,0,WARN,(check_type)psVar6,
             (size_t)&local_348,0xea);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(res3.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xeb;
  file_05.m_begin = (iterator)&local_358;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_368,
             msg_05);
  key_00 = dbwrapper_private::GetObfuscateKey(&odbw);
  res3.super_base_blob<256U>.m_data._M_elems[0] = is_null_key(key_00);
  res3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1d8._0_8_ = "is_null_key(dbwrapper_private::GetObfuscateKey(odbw))";
  local_1d8._8_8_ = "";
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       in2.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_011481f0;
  in2.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_370 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  in2.super_base_blob<256U>.m_data._M_elems._24_8_ = (string *)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&res3,(lazy_ostream *)&in2,1,0,WARN,(check_type)psVar6,
             (size_t)&local_378,0xeb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(res3.super_base_blob<256U>.m_data._M_elems + 0x10));
  RandomMixin<FastRandomContext>::rand256(&in2,&this_00->super_RandomMixin<FastRandomContext>);
  res3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xf1;
  file_06.m_begin = (iterator)&local_388;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_398,
             msg_06);
  local_1f8._M_dataplus._M_p._0_1_ = CDBWrapper::Write<unsigned_char,uint256>(&odbw,&key,&in2,false)
  ;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_allocated_capacity = 0;
  local_218._0_8_ = "odbw.Write(key, in2)";
  local_218._8_8_ = (long)"odbw.Write(key, in2)" + 0x14;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1d8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_3a0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1d8._24_8_ = local_218;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1f8,(lazy_ostream *)local_1d8,1,0,WARN,(check_type)psVar6,
             (size_t)&local_3a8,0xf1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1f8.field_2._M_allocated_capacity);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xf2;
  file_07.m_begin = (iterator)&local_3b8;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3c8,
             msg_07);
  local_1f8._M_dataplus._M_p._0_1_ = CDBWrapper::Read<unsigned_char,uint256>(&odbw,&key,&res3);
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_allocated_capacity = 0;
  local_218._0_8_ = "odbw.Read(key, res3)";
  local_218._8_8_ = (long)"odbw.Read(key, res3)" + 0x14;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1d8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_3d0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1d8._24_8_ = local_218;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1f8,(lazy_ostream *)local_1d8,1,0,WARN,(check_type)psVar6,
             (size_t)&local_3d8,0xf2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1f8.field_2._M_allocated_capacity);
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xf3;
  file_08.m_begin = (iterator)&local_3e8;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3f8,
             msg_08);
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_1d8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1d8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_400 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_1f8,(base_blob<256u> *)&res3);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_218,(base_blob<256u> *)&in2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_1d8,&local_408,0xf3,1,2,&local_1f8,"res3.ToString()",(string *)local_218,
             "in2.ToString()");
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  CDBWrapper::~CDBWrapper(&odbw);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::~unique_ptr(&dbw);
  std::filesystem::__cxx11::path::~path(&ph.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(existing_data_no_obfuscate)
{
    // We're going to share this fs::path between two wrappers
    fs::path ph = m_args.GetDataDirBase() / "existing_data_no_obfuscate";
    fs::create_directories(ph);

    // Set up a non-obfuscated wrapper to write some initial data.
    std::unique_ptr<CDBWrapper> dbw = std::make_unique<CDBWrapper>(DBParams{.path = ph, .cache_bytes = 1 << 10, .memory_only = false, .wipe_data = false, .obfuscate = false});
    uint8_t key{'k'};
    uint256 in = m_rng.rand256();
    uint256 res;

    BOOST_CHECK(dbw->Write(key, in));
    BOOST_CHECK(dbw->Read(key, res));
    BOOST_CHECK_EQUAL(res.ToString(), in.ToString());

    // Call the destructor to free leveldb LOCK
    dbw.reset();

    // Now, set up another wrapper that wants to obfuscate the same directory
    CDBWrapper odbw({.path = ph, .cache_bytes = 1 << 10, .memory_only = false, .wipe_data = false, .obfuscate = true});

    // Check that the key/val we wrote with unobfuscated wrapper exists and
    // is readable.
    uint256 res2;
    BOOST_CHECK(odbw.Read(key, res2));
    BOOST_CHECK_EQUAL(res2.ToString(), in.ToString());

    BOOST_CHECK(!odbw.IsEmpty()); // There should be existing data
    BOOST_CHECK(is_null_key(dbwrapper_private::GetObfuscateKey(odbw))); // The key should be an empty string

    uint256 in2 = m_rng.rand256();
    uint256 res3;

    // Check that we can write successfully
    BOOST_CHECK(odbw.Write(key, in2));
    BOOST_CHECK(odbw.Read(key, res3));
    BOOST_CHECK_EQUAL(res3.ToString(), in2.ToString());
}